

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O3

SUNErrCode
SUNClassicalGS(N_Vector *v,sunrealtype **h,int k,int p,sunrealtype *new_vk_norm,sunrealtype *stemp,
              N_Vector *vtemp)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  N_Vector p_Var4;
  int iVar5;
  long lVar6;
  sunrealtype sVar7;
  double dVar8;
  sunrealtype sVar9;
  double dVar10;
  
  uVar1 = k - p;
  if (k < p) {
    p = k;
  }
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  N_VDotProdMulti(p + 1U,v[k],v + uVar2,stemp);
  dVar8 = stemp[p];
  dVar10 = 0.0;
  if (0.0 < dVar8) {
    if (dVar8 < 0.0) {
      dVar10 = sqrt(dVar8);
    }
    else {
      dVar10 = SQRT(dVar8);
    }
  }
  iVar5 = k + -1;
  if (0 < p) {
    uVar3 = (ulong)(uint)p + 1;
    do {
      sVar7 = stemp[uVar3 - 2];
      h[uVar3 - 2][iVar5] = sVar7;
      stemp[uVar3 - 1] = -sVar7;
      vtemp[uVar3 - 1] = v[uVar3 - 2];
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  *stemp = 1.0;
  p_Var4 = v[k];
  *vtemp = p_Var4;
  N_VLinearCombination(p + 1U,stemp,vtemp,p_Var4);
  sVar7 = N_VDotProd(v[k],v[k]);
  dVar8 = 0.0;
  if (0.0 < sVar7) {
    sVar7 = N_VDotProd(v[k],v[k]);
    if (sVar7 < 0.0) {
      dVar8 = sqrt(sVar7);
    }
    else {
      dVar8 = SQRT(sVar7);
    }
  }
  *new_vk_norm = dVar8;
  if (dVar8 * 1000.0 < dVar10) {
    N_VDotProdMulti(p,v[k],v + uVar2,stemp + 1);
    *stemp = 1.0;
    p_Var4 = v[k];
    *vtemp = p_Var4;
    if ((int)uVar2 < k) {
      lVar6 = 0;
      do {
        h[uVar2 + lVar6][iVar5] = stemp[lVar6 + 1] + h[uVar2 + lVar6][iVar5];
        stemp[lVar6 + 1] = -stemp[lVar6 + 1];
        vtemp[lVar6 + 1] = v[lVar6];
        lVar6 = lVar6 + 1;
      } while ((uint)k - uVar2 != lVar6);
      p_Var4 = v[k];
    }
    N_VLinearCombination(k + 1,stemp,vtemp,p_Var4);
    sVar7 = N_VDotProd(v[k],v[k]);
    sVar9 = 0.0;
    if (0.0 < sVar7) {
      sVar9 = N_VDotProd(v[k],v[k]);
      if (sVar9 < 0.0) {
        sVar9 = sqrt(sVar9);
      }
      else {
        sVar9 = SQRT(sVar9);
      }
    }
    *new_vk_norm = sVar9;
  }
  return 0;
}

Assistant:

SUNErrCode SUNClassicalGS(N_Vector* v, sunrealtype** h, int k, int p,
                          sunrealtype* new_vk_norm, sunrealtype* stemp,
                          N_Vector* vtemp)
{
  SUNFunctionBegin(v[0]->sunctx);
  int i, i0, k_minus_1;
  sunrealtype vk_norm;

  k_minus_1 = k - 1;
  i0        = SUNMAX(k - p, 0);

  /* Perform Classical Gram-Schmidt */

  SUNCheckCall(N_VDotProdMulti(k - i0 + 1, v[k], v + i0, stemp));

  vk_norm = SUNRsqrt(stemp[k - i0]);
  for (i = k - i0 - 1; i >= 0; i--)
  {
    h[i][k_minus_1] = stemp[i];
    stemp[i + 1]    = -stemp[i];
    vtemp[i + 1]    = v[i];
  }
  stemp[0] = ONE;
  vtemp[0] = v[k];

  SUNCheckCall(N_VLinearCombination(k - i0 + 1, stemp, vtemp, v[k]));

  /* Compute the norm of the new vector at v[k] */

  *new_vk_norm = SUNRsqrt(N_VDotProd(v[k], v[k]));
  SUNCheckLastErr();

  /* Reorthogonalize if necessary */

  if ((FACTOR * (*new_vk_norm)) < vk_norm)
  {
    SUNCheckCall(N_VDotProdMulti(k - i0, v[k], v + i0, stemp + 1));

    stemp[0] = ONE;
    vtemp[0] = v[k];
    for (i = i0; i < k; i++)
    {
      h[i][k_minus_1] += stemp[i - i0 + 1];
      stemp[i - i0 + 1] = -stemp[i - i0 + 1];
      vtemp[i - i0 + 1] = v[i - i0];
    }

    SUNCheckCall(N_VLinearCombination(k + 1, stemp, vtemp, v[k]));

    *new_vk_norm = SUNRsqrt(N_VDotProd(v[k], v[k]));
    SUNCheckLastErr();
  }

  return SUN_SUCCESS;
}